

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

bool __thiscall
tsbp::TwoStepBranchingProcedure::PlaceAtCurrentX
          (TwoStepBranchingProcedure *this,Node *node,Rectangle *item)

{
  undefined8 uVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  size_t local_38;
  size_t newCandidateX;
  PackingRelaxed2D *packing;
  Rectangle *item_local;
  Node *node_local;
  TwoStepBranchingProcedure *this_local;
  
  packing = (PackingRelaxed2D *)item;
  item_local = (Rectangle *)node;
  node_local = (Node *)this;
  newCandidateX =
       (size_t)std::unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
               ::operator*(&node->Packing);
  bVar2 = IsPlacementFeasible(this,(PackingRelaxed2D *)newCandidateX,(Rectangle *)packing);
  if (bVar2) {
    uVar1 = *(undefined8 *)newCandidateX;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(newCandidateX + 0x58),
                        (long)item_local->X);
    *pvVar3 = (value_type)uVar1;
    local_38 = UpdatePlacedAreaAndDetermineLoss
                         (this,(PackingRelaxed2D *)newCandidateX,(Rectangle *)packing);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               (newCandidateX + 0x38),0,(long)packing->MaximumRemainingItemDx + 1);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (newCandidateX + 0x70),*(size_type *)newCandidateX);
    if (*pvVar4 == (long)(this->container).super_Rectangle.Dy) {
      *(size_t *)newCandidateX = local_38;
      *(undefined4 *)(newCandidateX + 8) = *(undefined4 *)(newCandidateX + 0xc);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                (&local_58,
                 (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (newCandidateX + 0x18));
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (newCandidateX + 0x38),&local_58);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (&local_58);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (newCandidateX + 0x38),(long)packing->MaximumRemainingItemDx);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TwoStepBranchingProcedure::PlaceAtCurrentX(Node& node, const Rectangle& item)
{
    PackingRelaxed2D& packing = *node.Packing;

    if (IsPlacementFeasible(packing, item))
    {
        packing.ItemCoordinatesX[node.ItemIdToPlace] = packing.MinX;

        size_t newCandidateX = UpdatePlacedAreaAndDetermineLoss(packing, item);
        ////size_t newX = UpdatePlacedAreaAndDetermineLossSS1(packing, item);

        packing.PlaceableItemsAtCurrentX.reset(0, (size_t)item.InternId + 1);

        if (packing.PlacedAreaVector[packing.MinX] == container.Dy)
        {
            packing.MinX = newCandidateX;

            // Must be reset because newX > packingMinX.
            // This lower bound can be raised by determining the remaining minY at newX at a cost of O(n) or by solving a subset sum problem in O(nC).
            packing.MinimumRemainingItemDyAtCurrentX = packing.MinimumRemainingItemDy;
            packing.PlaceableItemsAtCurrentX = ~packing.PlacedItems;
            packing.PlaceableItemsAtCurrentX.reset((size_t)item.InternId);
        }

        return true;
    }

    // Placement was infeasible.
    return false;
}